

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_drawinfo.cpp
# Opt level: O0

void __thiscall FDrawInfo::StartScene(FDrawInfo *this)

{
  uchar *puVar1;
  int local_18;
  int local_14;
  int i_1;
  int i;
  FDrawInfo *this_local;
  
  ClearBuffers(this);
  TArray<unsigned_char,_unsigned_char>::Resize(&this->sectorrenderflags,numsectors);
  TArray<unsigned_char,_unsigned_char>::Resize(&this->ss_renderflags,numsubsectors);
  TArray<unsigned_char,_unsigned_char>::Resize(&this->no_renderflags,numsubsectors);
  puVar1 = TArray<unsigned_char,_unsigned_char>::operator[](&this->sectorrenderflags,0);
  memset(puVar1,0,(long)numsectors);
  puVar1 = TArray<unsigned_char,_unsigned_char>::operator[](&this->ss_renderflags,0);
  memset(puVar1,0,(long)numsubsectors);
  puVar1 = TArray<unsigned_char,_unsigned_char>::operator[](&this->no_renderflags,0);
  memset(puVar1,0,(long)numnodes);
  this->next = gl_drawinfo;
  gl_drawinfo = this;
  for (local_14 = 0; local_14 < 8; local_14 = local_14 + 1) {
    GLDrawList::Reset(this->drawlists + local_14);
  }
  if (this->dldrawlists != (GLDrawList *)0x0) {
    for (local_18 = 0; local_18 < 8; local_18 = local_18 + 1) {
      GLDrawList::Reset(this->dldrawlists + local_18);
    }
  }
  return;
}

Assistant:

void FDrawInfo::StartScene()
{
	ClearBuffers();

	sectorrenderflags.Resize(numsectors);
	ss_renderflags.Resize(numsubsectors);
	no_renderflags.Resize(numsubsectors);

	memset(&sectorrenderflags[0], 0, numsectors * sizeof(sectorrenderflags[0]));
	memset(&ss_renderflags[0], 0, numsubsectors * sizeof(ss_renderflags[0]));
	memset(&no_renderflags[0], 0, numnodes * sizeof(no_renderflags[0]));

	next = gl_drawinfo;
	gl_drawinfo = this;
	for (int i = 0; i < GLDL_TYPES; i++) drawlists[i].Reset();
	if (dldrawlists != NULL)
	{
		for (int i = 0; i < GLLDL_TYPES; i++) dldrawlists[i].Reset();
	}
}